

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::uhugeint_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::HexUhugeIntOperator>>
               (uhugeint_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  uhugeint_t input;
  uhugeint_t input_00;
  uhugeint_t input_01;
  bool bVar1;
  undefined8 *puVar2;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  unsigned_long in_RDX;
  void *in_RSI;
  void *in_RDI;
  string_t sVar3;
  byte in_stack_00000008;
  idx_t i;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff28;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff30;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffff38;
  uint64_t in_stack_ffffffffffffff48;
  ulong uVar4;
  uint64_t in_stack_ffffffffffffff50;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff58;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff60;
  undefined8 local_98;
  idx_t local_90;
  unsigned_long local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  unsigned_long local_60;
  unsigned_long local_58;
  ulong local_50;
  ulong local_48;
  unsigned_long local_40;
  byte local_31;
  TemplatedValidityMask<unsigned_long> *local_20;
  unsigned_long local_18;
  void *local_10;
  void *local_8;
  
  local_31 = in_stack_00000008 & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RDX * 0x10),in_RSI,
             (void *)((long)in_RSI + in_RDX * 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/unary_executor.hpp"
             ,0x62);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_20);
  if (bVar1) {
    for (uVar4 = 0; uVar4 < local_18; uVar4 = uVar4 + 1) {
      input_01.upper = in_stack_ffffffffffffff50;
      input_01.lower = uVar4;
      in_stack_ffffffffffffff38.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           GenericUnaryWrapper::
           Operation<duckdb::UnaryStringOperator<duckdb::HexUhugeIntOperator>,duckdb::uhugeint_t,duckdb::string_t>
                     (input_01,(ValidityMask *)in_stack_ffffffffffffff38.pointer.ptr,
                      in_stack_ffffffffffffff38._0_8_,*(void **)((long)local_8 + uVar4 * 0x10 + 8));
      puVar2 = (undefined8 *)((long)local_10 + uVar4 * 0x10);
      *puVar2 = in_stack_ffffffffffffff38._0_8_;
      puVar2[1] = in_stack_ffffffffffffff38.pointer.ptr;
    }
  }
  else {
    if ((local_31 & 1) == 0) {
      TemplatedValidityMask<unsigned_long>::Initialize
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Copy
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    }
    local_40 = 0;
    local_48 = TemplatedValidityMask<unsigned_long>::EntryCount(0xf1d273);
    for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
      local_58 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_ffffffffffffff38._0_8_,(idx_t)in_stack_ffffffffffffff30);
      local_60 = MinValue<unsigned_long>(local_40 + 0x40,local_18);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_58);
      if (bVar1) {
        for (; local_40 < local_60; local_40 = local_40 + 1) {
          puVar2 = (undefined8 *)((long)local_8 + local_40 * 0x10);
          local_80 = *puVar2;
          local_78 = puVar2[1];
          input.upper = in_stack_ffffffffffffff50;
          input.lower = in_stack_ffffffffffffff48;
          local_70 = (undefined1  [16])
                     GenericUnaryWrapper::
                     Operation<duckdb::UnaryStringOperator<duckdb::HexUhugeIntOperator>,duckdb::uhugeint_t,duckdb::string_t>
                               (input,(ValidityMask *)in_stack_ffffffffffffff38.pointer.ptr,
                                in_stack_ffffffffffffff38._0_8_,in_stack_ffffffffffffff30);
          puVar2 = (undefined8 *)((long)local_10 + local_40 * 0x10);
          *puVar2 = local_70._0_8_;
          puVar2[1] = local_70._8_8_;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_58);
        if (bVar1) {
          local_40 = local_60;
        }
        else {
          local_88 = local_40;
          for (; local_40 < local_60; local_40 = local_40 + 1) {
            local_90 = local_40 - local_88;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_58,&local_90);
            if (bVar1) {
              in_stack_ffffffffffffff50 = *(uint64_t *)((long)local_8 + local_40 * 0x10);
              input_00.upper = in_stack_ffffffffffffff50;
              input_00.lower = in_stack_ffffffffffffff48;
              sVar3 = GenericUnaryWrapper::
                      Operation<duckdb::UnaryStringOperator<duckdb::HexUhugeIntOperator>,duckdb::uhugeint_t,duckdb::string_t>
                                (input_00,(ValidityMask *)in_stack_ffffffffffffff38.pointer.ptr,
                                 in_stack_ffffffffffffff38._0_8_,in_stack_ffffffffffffff30);
              puVar2 = (undefined8 *)((long)local_10 + local_40 * 0x10);
              *puVar2 = sVar3.value._0_8_;
              local_98 = sVar3.value._8_8_;
              puVar2[1] = local_98;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}